

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCADeserialization.cpp
# Opt level: O1

void __thiscall
Js::DeserializationCloner<Js::StreamReader>::CloneSet
          (DeserializationCloner<Js::StreamReader> *this,Src src,Dst dst)

{
  scaposition_t src_00;
  JavascriptSet *this_00;
  Engine *this_01;
  int iVar1;
  Var local_40;
  Var value;
  int32 size;
  
  this_00 = VarTo<Js::JavascriptSet>(dst);
  StreamReader::Read<int>(this->m_reader,(int *)((long)&value + 4));
  if (0 < value._4_4_) {
    iVar1 = 0;
    do {
      this_01 = ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                ::GetEngine(&this->
                             super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                           );
      src_00 = StreamReader::GetPosition(this->m_reader);
      SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::Clone
                (this_01,src_00,&local_40);
      if (local_40 == (Var)0x0) {
        ScriptContextHolder::ThrowSCADataCorrupt((ScriptContextHolder *)this);
      }
      JavascriptSet::Add(this_00,local_40);
      iVar1 = iVar1 + 1;
    } while (iVar1 < value._4_4_);
  }
  return;
}

Assistant:

void DeserializationCloner<Reader>::CloneSet(Src src, Dst dst)
    {
        JavascriptSet* set = VarTo<JavascriptSet>(dst);

        int32 size;
        m_reader->Read(&size);

        for (int i = 0; i < size; i++)
        {
            Var value;

            this->GetEngine()->Clone(m_reader->GetPosition(), &value);
            if (!value)
            {
                this->ThrowSCADataCorrupt();
            }

            set->Add(value);
        }
    }